

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tri_soft.c
# Opt level: O2

void shader_grad_any_init(uintptr_t state,ALLEGRO_VERTEX *v1,ALLEGRO_VERTEX *v2,ALLEGRO_VERTEX *v3)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  ALLEGRO_BITMAP *pAVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar27;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar33;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar34;
  float fVar35;
  ALLEGRO_COLOR AVar36;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  
  uVar1 = v2->x;
  uVar4 = v2->y;
  uVar2 = v1->x;
  uVar5 = v1->y;
  fVar30 = (float)uVar1 - (float)uVar2;
  fVar33 = (float)uVar4 - (float)uVar5;
  fVar35 = v3->x - (float)uVar2;
  fVar34 = v3->y - (float)uVar5;
  fVar28 = fVar34 * 0.0 + fVar35 * -0.0;
  fVar22 = fVar34 * fVar30 + -fVar35 * fVar33;
  fVar27 = fVar33 * 0.0 + fVar30 * -0.0;
  fVar23 = (fVar22 - fVar27) + fVar28;
  uVar9 = (v1->color).r;
  uVar10 = (v1->color).g;
  uVar11 = (v1->color).b;
  uVar12 = (v1->color).a;
  uVar13 = (v2->color).r;
  uVar14 = (v2->color).g;
  uVar15 = (v2->color).b;
  uVar16 = (v2->color).a;
  uVar17 = (v3->color).r;
  uVar18 = (v3->color).g;
  uVar19 = (v3->color).b;
  uVar20 = (v3->color).a;
  pAVar21 = al_get_target_bitmap();
  *(ALLEGRO_BITMAP **)state = pAVar21;
  uVar3 = v1->x;
  uVar6 = v1->y;
  *(ulong *)(state + 0x68) = CONCAT44((float)uVar6 + 0.5,(float)uVar3 + -0.5);
  if ((fVar23 != 0.0) || (NAN(fVar23))) {
    fVar24 = 0.0 - fVar30;
    fVar30 = fVar30 - fVar35;
    fVar35 = 0.0 - fVar35;
    fVar29 = fVar34 - fVar33;
    auVar31._0_8_ =
         CONCAT44(fVar33 * (float)uVar18 + (fVar29 * (float)uVar10 - fVar34 * (float)uVar14),
                  fVar33 * (float)uVar17 + (fVar29 * (float)uVar9 - fVar34 * (float)uVar13)) ^
         0x8000000080000000;
    auVar31._8_4_ = -(fVar33 * (float)uVar19 + (fVar29 * (float)uVar11 - fVar34 * (float)uVar15));
    auVar31._12_4_ = -(fVar33 * (float)uVar20 + (fVar29 * (float)uVar12 - fVar34 * (float)uVar16));
    auVar32._4_4_ = fVar23;
    auVar32._0_4_ = fVar23;
    auVar32._8_4_ = fVar23;
    auVar32._12_4_ = fVar23;
    auVar32 = divps(auVar31,auVar32);
    *(undefined1 (*) [16])(state + 0x18) = auVar32;
    auVar25._0_8_ =
         CONCAT44(fVar24 * (float)uVar18 + (fVar30 * (float)uVar10 - fVar35 * (float)uVar14),
                  fVar24 * (float)uVar17 + (fVar30 * (float)uVar9 - fVar35 * (float)uVar13)) ^
         0x8000000080000000;
    auVar25._8_4_ = -(fVar24 * (float)uVar19 + (fVar30 * (float)uVar11 - fVar35 * (float)uVar15));
    auVar25._12_4_ = -(fVar24 * (float)uVar20 + (fVar30 * (float)uVar12 - fVar35 * (float)uVar16));
    auVar7._4_4_ = fVar23;
    auVar7._0_4_ = fVar23;
    auVar7._8_4_ = fVar23;
    auVar7._12_4_ = fVar23;
    auVar32 = divps(auVar25,auVar7);
    *(undefined1 (*) [16])(state + 0x28) = auVar32;
    auVar26._0_4_ = fVar27 * (float)uVar17 + (fVar22 * (float)uVar9 - fVar28 * (float)uVar13);
    auVar26._4_4_ = fVar27 * (float)uVar18 + (fVar22 * (float)uVar10 - fVar28 * (float)uVar14);
    auVar26._8_4_ = fVar27 * (float)uVar19 + (fVar22 * (float)uVar11 - fVar28 * (float)uVar15);
    auVar26._12_4_ = fVar27 * (float)uVar20 + (fVar22 * (float)uVar12 - fVar28 * (float)uVar16);
    auVar8._4_4_ = fVar23;
    auVar8._0_4_ = fVar23;
    auVar8._8_4_ = fVar23;
    auVar8._12_4_ = fVar23;
    auVar32 = divps(auVar26,auVar8);
    *(undefined1 (*) [16])(state + 0x38) = auVar32;
  }
  else {
    AVar36 = al_map_rgba_f(0.0,0.0,0.0,0.0);
    *(ALLEGRO_COLOR *)(state + 0x38) = AVar36;
    *(undefined8 *)(state + 0x28) = *(undefined8 *)(state + 0x38);
    *(undefined8 *)(state + 0x30) = *(undefined8 *)(state + 0x40);
    *(undefined8 *)(state + 0x18) = *(undefined8 *)(state + 0x38);
    *(undefined8 *)(state + 0x20) = *(undefined8 *)(state + 0x40);
  }
  return;
}

Assistant:

static void shader_grad_any_init(uintptr_t state, ALLEGRO_VERTEX* v1, ALLEGRO_VERTEX* v2, ALLEGRO_VERTEX* v3)
{
   INIT_PREAMBLE

   ALLEGRO_COLOR v1c = v1->color;
   ALLEGRO_COLOR v2c = v2->color;
   ALLEGRO_COLOR v3c = v3->color;

   PLANE_DETS(r, v1c.r, v2c.r, v3c.r)
   PLANE_DETS(g, v1c.g, v2c.g, v3c.g)
   PLANE_DETS(b, v1c.b, v2c.b, v3c.b)
   PLANE_DETS(a, v1c.a, v2c.a, v3c.a)

   state_grad_any_2d* s = (state_grad_any_2d*)state;

   s->solid.target = al_get_target_bitmap();
   
   s->off_x = v1->x - 0.5f;
   s->off_y = v1->y + 0.5f;

   if (det_u == 0.0) {
      s->color_dx = s->color_dy = s->color_const = al_map_rgba_f(0, 0, 0, 0);
   }
   else {
      s->color_dx.r    = -r_det_x / det_u;
      s->color_dy.r    = -r_det_y / det_u;
      s->color_const.r = r_det / det_u;

      s->color_dx.g    = -g_det_x / det_u;
      s->color_dy.g    = -g_det_y / det_u;
      s->color_const.g = g_det / det_u;

      s->color_dx.b    = -b_det_x / det_u;
      s->color_dy.b    = -b_det_y / det_u;
      s->color_const.b = b_det / det_u;

      s->color_dx.a    = -a_det_x / det_u;
      s->color_dy.a    = -a_det_y / det_u;
      s->color_const.a = a_det / det_u;
   }
}